

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  cmMakefile *this_00;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar1;
  bool bVar2;
  TargetType targetType;
  int iVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string *psVar5;
  cmValue cVar6;
  undefined4 extraout_var;
  cmOutputConverter *outputConverter;
  string *linkCmd;
  pointer s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string launcher;
  string responseFlag;
  cmNinjaRule rule;
  char local_3da [2];
  cmRulePlaceholderExpander *local_3d8;
  cmAlphaNum local_3d0;
  undefined1 local_3a0 [48];
  string local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_350;
  string *local_338;
  char *local_330;
  string local_328;
  pointer local_308;
  size_type local_300;
  char local_2f8 [16];
  char *local_2e8;
  long local_2e0;
  RuleVariables local_2c8;
  undefined1 local_178 [64];
  string local_138 [32];
  string local_118 [96];
  char local_b8 [32];
  char local_98 [32];
  char local_78 [40];
  string local_50;
  
  LanguageLinkerDeviceRule(&local_50,this,config);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_178,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar2 = cmGlobalNinjaGenerator::HasRule(pcVar4,(string *)local_178);
  if (!bVar2) {
    memset(&local_2c8,0,0x150);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    local_2c8.CMTargetName = (psVar5->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType
                           ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                            GeneratorTarget);
    psVar5 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    local_2c8.CMTargetType = (psVar5->_M_dataplus)._M_p;
    local_2c8.Language = "CUDA";
    this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG",
               (allocator<char> *)local_3a0);
    psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_3d0);
    std::__cxx11::string::string((string *)&local_2e8,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_3d0);
    local_2c8.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    local_2c8.Objects = "$in";
    if ((useResponseFile) && (local_2e0 != 0)) {
      std::__cxx11::string::assign(local_b8);
      std::__cxx11::string::append((string *)&local_2e8);
      cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::assign(local_98);
      std::__cxx11::string::append(local_98);
      local_2c8.LinkLibraries = "";
      local_2c8.Objects = local_2e8;
    }
    local_2c8.ObjectDir = "$OBJECT_DIR";
    local_2c8.Target = "$TARGET_FILE";
    local_2c8.SONameFlag = "$SONAME_FLAG";
    local_2c8.TargetSOName = "$SONAME";
    local_2c8.TargetPDB = "$TARGET_PDB";
    local_2c8.TargetCompilePDB = "$TARGET_COMPILE_PDB";
    local_2c8.Flags = "$FLAGS";
    local_2c8.LinkFlags = "$LINK_FLAGS";
    local_2c8.Manifests = "$MANIFESTS";
    local_308 = local_2f8;
    local_300 = 0;
    local_2c8.LanguageCompileFlags = "$LANGUAGE_COMPILE_FLAGS";
    local_2f8[0] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"RULE_LAUNCH_LINK",(allocator<char> *)local_3a0);
    cVar6 = cmLocalGenerator::GetRuleLauncher
                      ((cmLocalGenerator *)pcVar1,target,(string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
      local_3d0.View_._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
      local_3a0._8_8_ = local_3a0 + 0x10;
      local_3a0._0_8_ = &DAT_00000001;
      local_3a0[0x10] = ' ';
      local_3d0.View_._M_len = (cVar6.Value)->_M_string_length;
      cmStrCat<>(&local_328,&local_3d0,(cmAlphaNum *)local_3a0);
      std::__cxx11::string::operator=((string *)&local_308,(string *)&local_328);
      std::__cxx11::string::~string((string *)&local_328);
    }
    iVar3 = (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    local_3d8 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar3);
    local_338 = config;
    ComputeDeviceLinkCmd_abi_cxx11_(&local_350,this);
    for (s = local_350.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        s != local_350.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      local_3d0.View_._M_len = local_300;
      local_3d0.View_._M_str = local_308;
      local_3a0._8_8_ = (s->_M_dataplus)._M_p;
      local_3a0._0_8_ = s->_M_string_length;
      cmStrCat<>(&local_328,&local_3d0,(cmAlphaNum *)local_3a0);
      std::__cxx11::string::operator=((string *)s,(string *)&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      outputConverter =
           &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      if (pcVar1 == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables(local_3d8,outputConverter,s,&local_2c8);
    }
    ::cm::
    erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmNinjaRemoveNoOpCommands>
              (&local_350);
    psVar5 = local_338;
    local_3a0._0_8_ = local_3a0 + 0x10;
    local_3a0._8_8_ = (char *)0x0;
    local_3a0[0x10] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)&local_3d0,(this->super_cmNinjaTargetGenerator).LocalGenerator,&local_350,
               local_338,local_338,(string *)local_3a0,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)(local_178 + 0x20),(string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)local_3a0);
    local_3d0.View_._M_len = (size_t)&DAT_00000011;
    local_3d0.View_._M_str = "Rule for linking ";
    TargetLinkLanguage(&local_370,this,psVar5);
    local_3a0._0_8_ = local_370._M_string_length;
    local_3a0._8_8_ = local_370._M_dataplus._M_p;
    local_3da[0] = ' ';
    local_330 = GetVisibleTypeName(this);
    local_3da[1] = 0x2e;
    cmStrCat<char,char_const*,char>
              (&local_328,&local_3d0,(cmAlphaNum *)local_3a0,local_3da,&local_330,local_3da + 1);
    std::__cxx11::string::operator=(local_118,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_370);
    local_3d0.View_._M_len = 8;
    local_3d0.View_._M_str = "Linking ";
    TargetLinkLanguage(&local_370,this,psVar5);
    local_3a0._0_8_ = local_370._M_string_length;
    local_3a0._8_8_ = local_370._M_dataplus._M_p;
    local_3da[0] = ' ';
    local_330 = GetVisibleTypeName(this);
    cmStrCat<char,char_const*,char[14]>
              (&local_328,&local_3d0,(cmAlphaNum *)local_3a0,local_3da,&local_330,
               (char (*) [14])0x644087);
    std::__cxx11::string::operator=(local_138,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::assign(local_78);
    pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_350);
    if (local_3d8 != (cmRulePlaceholderExpander *)0x0) {
      (*(local_3d8->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
    }
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_178);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule(
  bool useResponseFile, const std::string& config)
{
  cmNinjaRule rule(this->LanguageLinkerDeviceRule(config));
  if (!this->GetGlobalGenerator()->HasRule(rule.Name)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
        .c_str();

    vars.Language = "CUDA";

    // build response file name
    std::string responseFlag = this->GetMakefile()->GetSafeDefinition(
      "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG");

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    vars.LanguageCompileFlags = "$LANGUAGE_COMPILE_FLAGS";

    std::string launcher;
    cmValue val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (cmNonempty(val)) {
      launcher = cmStrCat(*val, ' ');
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";

    this->GetGlobalGenerator()->AddRule(rule);
  }
}